

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.h
# Opt level: O0

void __thiscall CPubKey::Set<unsigned_char*>(CPubKey *this,uchar *pbegin,uchar *pend)

{
  long lVar1;
  void *in_RDX;
  void *in_RSI;
  void *in_RDI;
  long in_FS_OFFSET;
  int len;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX == in_RSI) {
    uVar2 = 0;
  }
  else {
    uVar2 = GetLen((uchar)((uint)in_stack_ffffffffffffffc8 >> 0x18));
  }
  if ((uVar2 == 0) || ((long)(int)uVar2 != (long)in_RDX - (long)in_RSI)) {
    Invalidate((CPubKey *)CONCAT44(uVar2,in_stack_ffffffffffffffc8));
  }
  else {
    memcpy(in_RDI,in_RSI,(long)(int)uVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Set(const T pbegin, const T pend)
    {
        int len = pend == pbegin ? 0 : GetLen(pbegin[0]);
        if (len && len == (pend - pbegin))
            memcpy(vch, (unsigned char*)&pbegin[0], len);
        else
            Invalidate();
    }